

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O1

size_t move_NAs_to_front(size_t *ix_arr,size_t st,size_t end,int *x)

{
  size_t sVar1;
  size_t st_non_na;
  ulong uVar2;
  
  uVar2 = st;
  if (st <= end) {
    do {
      if (x[ix_arr[uVar2]] < 0) {
        sVar1 = ix_arr[st];
        ix_arr[st] = ix_arr[uVar2];
        ix_arr[uVar2] = sVar1;
        st = st + 1;
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 <= end);
  }
  return st;
}

Assistant:

size_t move_NAs_to_front(size_t ix_arr[], size_t st, size_t end, int x[])
{
    size_t st_non_na = st;
    size_t temp;

    for (size_t row = st; row <= end; row++)
    {
        if (unlikely(x[ix_arr[row]] < 0))
        {
            temp = ix_arr[st_non_na];
            ix_arr[st_non_na] = ix_arr[row];
            ix_arr[row] = temp;
            st_non_na++;
        }
    }

    return st_non_na;
}